

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::redirectPendingData(Private *this)

{
  code *pcVar1;
  uint __i;
  int iVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  timeval tv;
  fd_set fdr;
  char buffer [4096];
  
  while( true ) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      fdr.fds_bits[lVar3] = 0;
    }
    iVar2 = this->stdoutRead;
    fdr.fds_bits[iVar2 / 0x40] = fdr.fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
    iVar6 = this->stderrRead;
    fdr.fds_bits[iVar6 / 0x40] = fdr.fds_bits[iVar6 / 0x40] | 1L << ((byte)iVar6 & 0x3f);
    tv.tv_sec = 0;
    tv.tv_usec = 0;
    if (iVar6 < iVar2) {
      iVar6 = iVar2;
    }
    iVar2 = select(iVar6 + 1,(fd_set *)&fdr,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
    if (iVar2 == 0) {
      return;
    }
    if (iVar2 == -1) break;
    iVar2 = this->stdoutRead;
    if (((((ulong)fdr.fds_bits[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) != 0) &&
        (((sVar4 = read(iVar2,buffer,0x1000), sVar4 == 0xffffffffffffffff &&
          (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                                 ,0x35c,"i != -1"), iVar2 != 0)) ||
         ((sVar5 = write(originalStdout,buffer,sVar4), sVar5 != sVar4 &&
          (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                                 ,0x35d,"write(originalStdout, buffer, i) == i"), iVar2 != 0))))))
       || ((iVar2 = this->stderrRead,
           ((ulong)fdr.fds_bits[iVar2 / 0x40] >> ((long)iVar2 % 0x40 & 0x3fU) & 1) != 0 &&
           (((sVar4 = read(iVar2,buffer,0x1000), sVar4 == 0xffffffffffffffff &&
             (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                                    ,0x363,"i != -1"), iVar2 != 0)) ||
            ((sVar5 = write(this->originalStderr,buffer,sVar4), sVar5 != sVar4 &&
             (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                                    ,0x364,"write(originalStderr, buffer, i) == i"), iVar2 != 0)))))
           ))) goto LAB_0010a7d9;
  }
  iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                        ,0x353,"false");
  if (iVar2 == 0) {
    return;
  }
LAB_0010a7d9:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void redirectPendingData()
  {
#ifdef _MSC_VER
    DWORD read;
    while(GetOverlappedResult(hStdOutRead, &outOverlapped, &read, FALSE))
    {
        DWORD written;
        VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
        ASSERT(written == read / sizeof(char));
        while(ReadFile(hStdOutRead, stdoutBuffer, sizeof(stdoutBuffer), &read, &outOverlapped))
        {
          VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
          ASSERT(written == read / sizeof(char));
        }
    }
    while(GetOverlappedResult(hStdErrRead, &errOverlapped, &read, FALSE))
    {
        DWORD written;
        VERIFY(WriteConsole(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
        ASSERT(written == read / sizeof(char));
        while(ReadFile(hStdErrRead, stderrBuffer, sizeof(stderrBuffer), &read, &errOverlapped))
        {
          VERIFY(WriteConsole(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
          ASSERT(written == read / sizeof(char));
        }
    }
#else
    for(;;)
    {
      fd_set fdr;
      FD_ZERO(&fdr);
      FD_SET(stdoutRead, &fdr);
      FD_SET(stderrRead, &fdr);
      timeval tv = {0, 0};
      switch(select((stdoutRead > stderrRead ? stdoutRead : stderrRead) + 1, &fdr, 0, 0, &tv))
      {
      case -1:
        ASSERT(false);
        return;
      case 0:
        break;
      default: // todo: redirect data character by character to ensure utf8 and escaped sequences are valid?
        if(FD_ISSET(stdoutRead, &fdr))
        {
          char buffer[4096];
          ssize i = read(stdoutRead, buffer, sizeof(buffer));
          VERIFY(i != -1);
          VERIFY(write(originalStdout, buffer, i) == i);
        }
        if(FD_ISSET(stderrRead, &fdr))
        {
          char buffer[4096];
          ssize i = read(stderrRead, buffer, sizeof(buffer));
          VERIFY(i != -1);
          VERIFY(write(originalStderr, buffer, i) == i);
        }
        continue;
      }
      break;
    }
#endif
  }